

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.hpp
# Opt level: O0

void __thiscall libtorrent::dht::ip_set::~ip_set(ip_set *this)

{
  ip_set *this_local;
  
  ::std::
  unordered_multiset<std::array<unsigned_char,_16UL>,_libtorrent::dht::ipv6_hash,_std::equal_to<std::array<unsigned_char,_16UL>_>,_std::allocator<std::array<unsigned_char,_16UL>_>_>
  ::~unordered_multiset(&this->m_ip6s);
  ::std::
  unordered_multiset<std::array<unsigned_char,_4UL>,_libtorrent::dht::ipv4_hash,_std::equal_to<std::array<unsigned_char,_4UL>_>,_std::allocator<std::array<unsigned_char,_4UL>_>_>
  ::~unordered_multiset(&this->m_ip4s);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT ip_set
{
	void insert(address const& addr);
	bool exists(address const& addr) const;
	void erase(address const& addr);

	void clear()
	{
		m_ip4s.clear();
		m_ip6s.clear();
	}

	bool operator==(ip_set const& rh)
	{
		return m_ip4s == rh.m_ip4s && m_ip6s == rh.m_ip6s;
	}

	std::size_t size() const { return m_ip4s.size() + m_ip6s.size(); }

	// these must be multisets because there can be multiple routing table
	// entries for a single IP when restrict_routing_ips is set to false
	std::unordered_multiset<address_v4::bytes_type, ipv4_hash> m_ip4s;
	std::unordered_multiset<address_v6::bytes_type, ipv6_hash> m_ip6s;
}